

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:213:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:213:17)>
            *this)

{
  Server *pSVar1;
  undefined8 *puVar2;
  Own<capnp::ClientHook> OVar3;
  Own<capnp::Capability::Server> local_18;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  local_18.ptr = (Server *)(puVar2 + 3);
  puVar2[4] = 0;
  *puVar2 = 0x60a990;
  puVar2[3] = 0x60a9c0;
  puVar2[1] = "outside";
  puVar2[2] = 8;
  local_18.disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::ThingImpl>::instance;
  OVar3 = capnp::Capability::Client::makeLocalClient
                    ((Client *)&__return_storage_ptr__->field_0x8,&local_18);
  pSVar1 = local_18.ptr;
  if (local_18.ptr != (Server *)0x0) {
    local_18.ptr = (Server *)0x0;
    (**(local_18.disposer)->_vptr_Disposer)
              (local_18.disposer,
               (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]),OVar3.ptr
              );
  }
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }